

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  Prog prog;
  Theme theme;
  ALLEGRO_FONT *font;
  ALLEGRO_DISPLAY *display;
  Prog *in_stack_fffffffffffff440;
  ALLEGRO_FONT *in_stack_fffffffffffff468;
  Theme *in_stack_fffffffffffff470;
  Prog *in_stack_fffffffffffff4d0;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro\n");
  }
  al_init_primitives_addon();
  al_install_keyboard();
  al_install_mouse();
  al_init_font_addon();
  al_init_image_addon();
  init_platform_specific();
  al_set_new_display_flags(0x40);
  lVar2 = al_create_display(800,600);
  if (lVar2 == 0) {
    abort_example("Unable to create display\n");
  }
  lVar2 = al_load_font("data/fixed_font.tga",0);
  if (lVar2 == 0) {
    abort_example("Failed to load data/fixed_font.tga\n");
  }
  allegro = (ALLEGRO_BITMAP *)al_load_bitmap("data/allegro.pcx");
  if (allegro == (ALLEGRO_BITMAP *)0x0) {
    abort_example("Failed to load data/allegro.pcx\n");
  }
  mysha = (ALLEGRO_BITMAP *)al_load_bitmap("data/mysha256x256.png");
  if (mysha == (ALLEGRO_BITMAP *)0x0) {
    abort_example("Failed to load data/mysha256x256.png\n");
  }
  target = (ALLEGRO_BITMAP *)al_create_bitmap(0x140,200);
  al_add_new_bitmap_flag(1);
  allegro_bmp = (ALLEGRO_BITMAP *)al_clone_bitmap(allegro);
  mysha_bmp = (ALLEGRO_BITMAP *)al_clone_bitmap(mysha);
  target_bmp = (ALLEGRO_BITMAP *)al_clone_bitmap(target);
  Theme::Theme(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  Prog::Prog((Prog *)prog.d.event_handler,(Theme *)prog.d.key_widget,
             (ALLEGRO_DISPLAY *)prog.d.mouse_down_widget);
  Prog::run(in_stack_fffffffffffff440);
  Prog::~Prog(in_stack_fffffffffffff4d0);
  al_destroy_bitmap(allegro);
  al_destroy_bitmap(allegro_bmp);
  al_destroy_bitmap(mysha);
  al_destroy_bitmap(mysha_bmp);
  al_destroy_bitmap(target);
  al_destroy_bitmap(target_bmp);
  al_destroy_font(lVar2);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();

   al_init_font_addon();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Unable to create display\n");
   }

   font = al_load_font("data/fixed_font.tga", 0, 0);
   if (!font) {
      abort_example("Failed to load data/fixed_font.tga\n");
   }
   allegro = al_load_bitmap("data/allegro.pcx");
   if (!allegro) {
      abort_example("Failed to load data/allegro.pcx\n");
   }
   mysha = al_load_bitmap("data/mysha256x256.png");
   if (!mysha) {
      abort_example("Failed to load data/mysha256x256.png\n");
   }
   
   target = al_create_bitmap(320, 200);

   al_add_new_bitmap_flag(ALLEGRO_MEMORY_BITMAP);
   allegro_bmp = al_clone_bitmap(allegro);
   mysha_bmp = al_clone_bitmap(mysha);
   target_bmp = al_clone_bitmap(target);

   /* Don't remove these braces. */
   {
      Theme theme(font);
      Prog prog(theme, display);
      prog.run();
   }

   al_destroy_bitmap(allegro);
   al_destroy_bitmap(allegro_bmp);
   al_destroy_bitmap(mysha);
   al_destroy_bitmap(mysha_bmp);
   al_destroy_bitmap(target);
   al_destroy_bitmap(target_bmp);

   al_destroy_font(font);

   return 0;
}